

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_24::BinaryReader::ReadSections(BinaryReader *this)

{
  size_t sVar1;
  Result RVar2;
  BinarySectionOrder BVar3;
  BinarySectionOrder BVar4;
  int iVar5;
  Enum EVar6;
  ulong uVar7;
  char *format;
  char *pcVar8;
  Index i;
  ulong uVar9;
  uint32_t name_type;
  Index function_index;
  Index num_locals;
  Index num_names;
  string_view name;
  uint32_t kind;
  Index local_index;
  Offset subsection_size;
  Index num_data_segments;
  uint32_t offset;
  uint32_t size;
  uint32_t section_code;
  bool seen_section_code [14];
  Offset section_size;
  
  seen_section_code[8] = false;
  seen_section_code[9] = false;
  seen_section_code[10] = false;
  seen_section_code[0xb] = false;
  seen_section_code[0xc] = false;
  seen_section_code[0xd] = false;
  seen_section_code[0] = false;
  seen_section_code[1] = false;
  seen_section_code[2] = false;
  seen_section_code[3] = false;
  seen_section_code[4] = false;
  seen_section_code[5] = false;
  seen_section_code[6] = false;
  seen_section_code[7] = false;
  if ((this->state_).size <= (this->state_).offset) {
    return (Result)Ok;
  }
  RVar2 = ReadU32Leb128(this,&section_code,"section code");
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  RVar2 = ReadOffset(this,&section_size,"section size");
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  sVar1 = this->read_end_;
  uVar7 = (this->state_).offset + section_size;
  this->read_end_ = uVar7;
  uVar9 = (ulong)section_code;
  if (0xd < uVar9) {
    PrintError(this,"invalid section code: %u",uVar9);
    goto LAB_0016d1fd;
  }
  if (section_code == 0) {
LAB_0016a296:
    if ((this->state_).size < uVar7) {
      pcVar8 = "invalid section size: extends past end";
    }
    else {
      if ((section_code != 0) && (this->last_known_section_ != Invalid)) {
        BVar3 = GetSectionOrder(section_code);
        BVar4 = GetSectionOrder(this->last_known_section_);
        if ((int)BVar3 <= (int)BVar4) {
          pcVar8 = GetSectionName(section_code);
          format = "section %s out of order";
          goto LAB_0016d1f0;
        }
      }
      if ((section_code != 0) && (this->did_read_names_section_ != false)) {
        pcVar8 = GetSectionName(section_code);
        format = "%s section can not occur after Name section";
        goto LAB_0016d1f0;
      }
      iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                        (this->delegate_,0,(ulong)section_code,section_size);
      if (iVar5 == 0) {
        EVar6 = (*(code *)(&DAT_001859f4 + *(int *)(&DAT_001859f4 + uVar9 * 4)))();
        return (Result)EVar6;
      }
      pcVar8 = "BeginSection callback failed";
    }
    PrintError(this,pcVar8);
  }
  else {
    if (seen_section_code[uVar9] != true) {
      seen_section_code[uVar9] = true;
      goto LAB_0016a296;
    }
    pcVar8 = GetSectionName(section_code);
    format = "multiple %s sections";
LAB_0016d1f0:
    PrintError(this,format,pcVar8);
  }
LAB_0016d1fd:
  this->read_end_ = sVar1;
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadSections() {
  Result result = Result::Ok;
  Index section_index = 0;
  bool seen_section_code[static_cast<int>(BinarySection::Last) + 1] = {false};

  for (; state_.offset < state_.size; ++section_index) {
    uint32_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU32Leb128(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u", section_code);
      return Result::Error;
    }

    BinarySection section = static_cast<BinarySection>(section_code);
    if (section != BinarySection::Custom) {
      if (seen_section_code[section_code]) {
        PrintError("multiple %s sections", GetSectionName(section));
        return Result::Error;
      }
      seen_section_code[section_code] = true;
    }

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(
        last_known_section_ == BinarySection::Invalid ||
            section == BinarySection::Custom ||
            GetSectionOrder(section) > GetSectionOrder(last_known_section_),
        "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section_index, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Event:
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadEventSection(section_size);
        result |= section_result;
        break;
      case BinarySection::DataCount:
        ERROR_UNLESS(options_.features.bulk_memory_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadDataCountSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Succeeded(section_result) && state_.offset != read_end_) {
      PrintError("unfinished section (expected end: 0x%" PRIzx ")", read_end_);
      section_result = Result::Error;
      result |= section_result;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }


    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}